

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicstransform.cpp
# Opt level: O3

void QGraphicsScale::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 uVar1;
  QVector3D *point;
  undefined8 *puVar2;
  code *pcVar3;
  long lVar4;
  int iVar5;
  undefined8 uVar6;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      iVar5 = 0;
      break;
    case 1:
      iVar5 = 1;
      break;
    case 2:
      iVar5 = 2;
      break;
    case 3:
      iVar5 = 3;
      break;
    case 4:
      iVar5 = 4;
      break;
    default:
      goto switchD_0062ba75_caseD_3;
    }
    QMetaObject::activate(_o,&staticMetaObject,iVar5,(void **)0x0);
    return;
  case ReadProperty:
    if ((uint)_id < 4) {
      puVar2 = (undefined8 *)*_a;
      switch(_id) {
      case 0:
        uVar1 = *(undefined4 *)(*(long *)(_o + 8) + 0x88);
        *puVar2 = *(undefined8 *)(*(long *)(_o + 8) + 0x80);
        *(undefined4 *)(puVar2 + 1) = uVar1;
        return;
      case 1:
        uVar6 = *(undefined8 *)(*(long *)(_o + 8) + 0x90);
        break;
      case 2:
        uVar6 = *(undefined8 *)(*(long *)(_o + 8) + 0x98);
        break;
      case 3:
        uVar6 = *(undefined8 *)(*(long *)(_o + 8) + 0xa0);
      }
      *puVar2 = uVar6;
      return;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 4) {
      point = (QVector3D *)*_a;
      switch(_id) {
      case 0:
        setOrigin((QGraphicsScale *)_o,point);
        return;
      case 1:
        setXScale((QGraphicsScale *)_o,*(qreal *)point->v);
        return;
      case 2:
        setYScale((QGraphicsScale *)_o,*(qreal *)point->v);
        return;
      case 3:
        setZScale((QGraphicsScale *)_o,*(qreal *)point->v);
        return;
      }
    }
    break;
  case IndexOfMethod:
    pcVar3 = *_a[1];
    lVar4 = *(long *)((long)_a[1] + 8);
    if (pcVar3 == originChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 0;
      return;
    }
    if (pcVar3 == xScaleChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 1;
      return;
    }
    if (pcVar3 == yScaleChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 2;
      return;
    }
    if (pcVar3 == zScaleChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 3;
      return;
    }
    if (pcVar3 == scaleChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 4;
      return;
    }
  }
switchD_0062ba75_caseD_3:
  return;
}

Assistant:

void QGraphicsScale::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsScale *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->originChanged(); break;
        case 1: _t->xScaleChanged(); break;
        case 2: _t->yScaleChanged(); break;
        case 3: _t->zScaleChanged(); break;
        case 4: _t->scaleChanged(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsScale::*)()>(_a, &QGraphicsScale::originChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsScale::*)()>(_a, &QGraphicsScale::xScaleChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsScale::*)()>(_a, &QGraphicsScale::yScaleChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsScale::*)()>(_a, &QGraphicsScale::zScaleChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsScale::*)()>(_a, &QGraphicsScale::scaleChanged, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QVector3D*>(_v) = _t->origin(); break;
        case 1: *reinterpret_cast<qreal*>(_v) = _t->xScale(); break;
        case 2: *reinterpret_cast<qreal*>(_v) = _t->yScale(); break;
        case 3: *reinterpret_cast<qreal*>(_v) = _t->zScale(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOrigin(*reinterpret_cast<QVector3D*>(_v)); break;
        case 1: _t->setXScale(*reinterpret_cast<qreal*>(_v)); break;
        case 2: _t->setYScale(*reinterpret_cast<qreal*>(_v)); break;
        case 3: _t->setZScale(*reinterpret_cast<qreal*>(_v)); break;
        default: break;
        }
    }
}